

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::DrawTest::iterate(DrawTest *this)

{
  int *piVar1;
  Storage *this_00;
  int iVar2;
  uint uVar3;
  IndexType IVar4;
  pointer pDVar5;
  pointer pAVar6;
  TestLog *log;
  pointer ppAVar7;
  size_t __n;
  long lVar8;
  DrawTestSpec *pDVar9;
  Storage storage;
  Usage usage;
  int iVar10;
  Float<unsigned_short,_5,_10,_15,_1U> FVar11;
  Float<unsigned_short,_5,_10,_15,_1U> FVar12;
  Float<unsigned_short,_5,_10,_15,_1U> FVar13;
  int iVar14;
  CompatibilityTestType CVar15;
  int iVar16;
  deUint32 dVar17;
  deUint32 dVar18;
  deUint32 dVar19;
  Float<unsigned_int,_8,_23,_127,_3U> FVar20;
  Float<unsigned_int,_8,_23,_127,_3U> FVar21;
  deUint32 dVar22;
  uint uVar23;
  uint uVar24;
  pointer pAVar25;
  ulong uVar26;
  AttributeArray *pAVar27;
  AttributeArray *this_01;
  undefined8 uVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  char cVar33;
  byte bVar34;
  byte bVar35;
  short sVar36;
  ushort uVar37;
  ushort uVar38;
  InputType IVar39;
  InputType IVar40;
  uint uVar41;
  size_t testIteration;
  int i;
  IterateResult IVar42;
  ulong uVar43;
  uint uVar44;
  anon_union_8_10_1f5805e9_for_GLValue_1 aVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  float fVar50;
  InputType IVar51;
  uint uVar52;
  char cVar53;
  short sVar54;
  undefined2 uVar55;
  char *size;
  int vertexCount;
  DrawTest *pDVar56;
  uint *puVar57;
  char cVar58;
  short sVar59;
  char *pcVar60;
  bool bVar61;
  deUint32 u32;
  float coordScale;
  float colorScale;
  float fVar62;
  float fVar63;
  char *pcVar64;
  GLValue GVar65;
  GLValue GVar66;
  Float<unsigned_int,_8,_23,_127,_3U> local_2ec;
  ulong local_2e8;
  char *local_2e0;
  long local_2d8;
  char *local_2d0;
  uint local_2c4;
  char *local_2c0;
  DrawTest *local_2b8;
  byte local_2a9;
  DrawTestSpec *local_2a8;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_2a0;
  deRandom rnd_4;
  Random random;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  char *local_250;
  Vec4 retVal;
  IterationLogSectionEmitter sectionEmitter;
  AttributeSpec attribSpec;
  ios_base local_140 [272];
  
  iVar2 = this->m_iteration;
  bVar61 = (long)iVar2 == 0;
  iVar14 = iVar2 % 2;
  pDVar5 = (this->m_specs).
           super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar46 = (long)(this->m_specs).
                 super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar5;
  lVar31 = lVar46 >> 4;
  testIteration = (size_t)(iVar2 / 2);
  local_2a8 = pDVar5 + testIteration;
  if (iVar14 == 0 && !bVar61) {
    pAVar25 = (local_2a8->attribs).
              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar6 = (local_2a8->attribs).
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar47 = (long)pAVar6 - (long)pAVar25;
    lVar32 = *(long *)&pDVar5[testIteration - 1].attribs.
                       super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                       ._M_impl;
    if (lVar47 == (long)*(pointer *)
                         ((long)&pDVar5[testIteration - 1].attribs.
                                 super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                 ._M_impl + 8) - lVar32) {
      bVar61 = pAVar6 == pAVar25;
      if (!bVar61) {
        uVar48 = (lVar47 >> 3) * -0x3333333333333333;
        if (pAVar25->additionalPositionAttribute != (bool)*(char *)(lVar32 + 0x25))
        goto LAB_00969347;
        uVar49 = 1;
        bVar61 = false;
        lVar47 = 4;
        do {
          uVar52 = *(uint *)((long)&pAVar25->inputType + lVar47);
          if ((3 < uVar52) || (3 < *(uint *)(lVar32 + lVar47))) {
            if (0xb < uVar52) break;
            if ((0x1d0U >> (uVar52 & 0x1f) & 1) == 0) {
              if ((0xe20U >> (uVar52 & 0x1f) & 1) == 0) break;
            }
            else {
              if ((*(uint *)(lVar32 + lVar47) < 9) &&
                 ((0x1d0U >> (*(uint *)(lVar32 + lVar47) & 0x1f) & 1) != 0)) goto LAB_00969311;
              if ((2 < uVar52 - 9) && (uVar52 != 5)) break;
            }
            if ((2 < *(int *)(lVar32 + lVar47) - 9U) && (*(int *)(lVar32 + lVar47) != 5)) break;
          }
LAB_00969311:
          bVar61 = uVar48 <= uVar49;
          if (uVar48 + (uVar48 == 0) == uVar49) break;
          lVar8 = lVar47 + 1;
          uVar49 = uVar49 + 1;
          pcVar60 = (char *)(lVar32 + 0x49 + lVar47);
          lVar47 = lVar47 + 0x28;
        } while (*(char *)((long)&pAVar25[1].instanceDivisor + lVar8) == *pcVar60);
      }
    }
    else {
LAB_00969347:
      bVar61 = false;
    }
    bVar61 = (bool)(bVar61 ^ 1);
  }
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_2b8 = this;
  if (iVar14 == 0) {
    pDVar56 = (DrawTest *)&sectionEmitter;
    anon_unknown_1::IterationLogSectionEmitter::IterationLogSectionEmitter
              ((IterationLogSectionEmitter *)pDVar56,log,testIteration,lVar31 * -0x3333333333333333,
               (this->m_iteration_descriptions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + testIteration,lVar46 != 0x50);
    pDVar9 = local_2a8;
    uVar52 = *(uint *)((anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::
                       infos + (long)(int)local_2a8->drawMethod * 6);
    uVar38 = *(ushort *)
              ((anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
              (long)(int)local_2a8->drawMethod * 6 + 4);
    if (local_2a8->primitive < PRIMITIVE_LAST) {
      lVar46 = (long)local_2a8->primitiveCount;
      switch(local_2a8->primitive) {
      case PRIMITIVE_POINTS:
        break;
      default:
        lVar46 = lVar46 + 2;
        break;
      case PRIMITIVE_LINES:
        lVar46 = lVar46 * 2;
        break;
      case PRIMITIVE_LINE_STRIP:
        lVar46 = lVar46 + 1;
        break;
      case PRIMITIVE_LINE_LOOP:
        if (local_2a8->primitiveCount == 1) {
          lVar46 = 2;
        }
        break;
      case PRIMITIVE_LINES_ADJACENCY:
        lVar46 = lVar46 << 2;
        break;
      case PRIMITIVE_LINE_STRIP_ADJACENCY:
        lVar46 = lVar46 + 3;
        break;
      case PRIMITIVE_TRIANGLES_ADJACENCY:
        lVar46 = lVar46 * 2;
      case PRIMITIVE_TRIANGLES:
        lVar46 = lVar46 * 3;
        break;
      case PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
        lVar46 = lVar46 * 2 + 4;
      }
    }
    else {
      lVar46 = 0;
    }
    uVar29 = 0;
    if ((uVar52 >> 0x10 & 1) != 0) {
      uVar29 = local_2a8->indexMin;
    }
    iVar14 = 0;
    if ((uVar52 >> 0x18 & 1) != 0) {
      iVar14 = local_2a8->first;
    }
    uVar3 = local_2a8->baseVertex;
    uVar41 = 0;
    if (0 < (int)uVar3) {
      uVar41 = uVar3;
    }
    uVar3 = (int)uVar3 >> 0x1f & -uVar3;
    if ((uVar38 & 1) == 0) {
      uVar3 = 0;
    }
    vertexCount = (int)lVar46;
    uVar30 = iVar14 + -1 + uVar29 + vertexCount;
    if ((uVar52 >> 0x10 & 1) != 0) {
      uVar44 = local_2a8->indexMax;
      if ((int)uVar44 < (int)uVar30) {
        uVar30 = uVar44;
      }
      if ((int)uVar44 < 0) {
        uVar30 = 0;
      }
    }
    local_2c4 = 0;
    if (0 < (int)uVar30) {
      local_2c4 = uVar30;
    }
    coordScale = getCoordScale(pDVar56,local_2a8);
    colorScale = getColorScale(pDVar56,pDVar9);
    attribSpec._0_8_ = ((local_2b8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    this_00 = &attribSpec.storage;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    DrawTestSpec::getMultilineDesc_abi_cxx11_((string *)&random,local_2a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(char *)random.m_rnd._0_8_,random.m_rnd._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&attribSpec,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)random.m_rnd._0_8_ != &local_268) {
      operator_delete((void *)random.m_rnd._0_8_,local_268._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    std::ios_base::~ios_base(local_140);
    attribSpec._0_8_ = ((local_2b8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&attribSpec.storage);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&attribSpec,(EndMessageToken *)&tcu::TestLog::EndMessage);
    uVar48 = lVar46 + (int)uVar29 +
             (long)iVar14 +
             (ulong)((uint)((long)((ulong)CONCAT24(uVar38,uVar52) << 0x1f) >> 0x3f) & uVar41);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&attribSpec.storage);
    std::ios_base::~ios_base(local_140);
    pDVar56 = local_2b8;
    AttributePack::clearArrays(local_2b8->m_glArrayPack);
    AttributePack::clearArrays(pDVar56->m_rrArrayPack);
    pAVar25 = (local_2a8->attribs).
              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(local_2a8->attribs).
                                super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar25) >> 3) *
            -0x33333333) {
      uVar49 = 0;
      do {
        pDVar9 = local_2a8;
        pAVar6 = pAVar25 + uVar49;
        uVar28._0_4_ = pAVar6->instanceDivisor;
        uVar28._4_1_ = pAVar6->useDefaultAttribute;
        uVar28._5_1_ = pAVar6->additionalPositionAttribute;
        uVar28._6_1_ = pAVar6->bgraComponentOrder;
        uVar28._7_1_ = pAVar6->field_0x27;
        pAVar6 = pAVar25 + uVar49;
        attribSpec.inputType = pAVar6->inputType;
        attribSpec.outputType = pAVar6->outputType;
        attribSpec.storage = pAVar6->storage;
        attribSpec.usage = pAVar6->usage;
        pAVar25 = pAVar25 + uVar49;
        attribSpec.componentCount = pAVar25->componentCount;
        attribSpec.offset = pAVar25->offset;
        attribSpec.stride = pAVar25->stride;
        attribSpec.normalize = pAVar25->normalize;
        attribSpec._29_3_ = *(undefined3 *)&pAVar25->field_0x1d;
        local_2a9 = uVar49 == 0 | uVar28._5_1_;
        attribSpec._32_8_ = uVar28;
        iVar14 = DrawTestSpec::AttributeSpec::hash(&attribSpec);
        iVar16 = DrawTestSpec::hash(pDVar9);
        IVar51 = attribSpec.inputType;
        if (uVar28._4_1_ == true) {
          deRandom_init(&random.m_rnd,(int)uVar49 + iVar14 * 10 + iVar16 * 100);
          if (IVar51 == INPUTTYPE_UNSIGNED_INT) {
            retVal.m_data[0] = 0.0;
            retVal.m_data[1] = 0.0;
            retVal.m_data[2] = 0.0;
            retVal.m_data[3] = 0.0;
            lVar46 = 0;
            do {
              fVar62 = (float)deRandom_getUint32(&random.m_rnd);
              retVal.m_data[lVar46] = fVar62;
              lVar46 = lVar46 + 1;
            } while (lVar46 != 4);
LAB_00969db9:
            pDVar56 = (DrawTest *)((ulong)retVal.m_data._0_8_ >> 0x20);
            fVar62 = retVal.m_data[0];
            fVar63 = retVal.m_data[2];
            fVar50 = retVal.m_data[3];
          }
          else {
            if (IVar51 == INPUTTYPE_INT) {
              retVal.m_data[0] = 0.0;
              retVal.m_data[1] = 0.0;
              retVal.m_data[2] = 0.0;
              retVal.m_data[3] = 0.0;
              lVar46 = 0;
              do {
                fVar62 = (float)deRandom_getUint32(&random.m_rnd);
                retVal.m_data[lVar46] = fVar62;
                lVar46 = lVar46 + 1;
              } while (lVar46 != 4);
              goto LAB_00969db9;
            }
            pDVar56 = (DrawTest *)0x3f800000;
            fVar62 = 1.0;
            fVar63 = 1.0;
            fVar50 = 1.0;
            if (IVar51 == INPUTTYPE_FLOAT) {
              retVal.m_data[0] = 0.0;
              retVal.m_data[1] = 0.0;
              retVal.m_data[2] = 0.0;
              retVal.m_data[3] = 0.0;
              lVar46 = 0;
              do {
                fVar62 = deRandom_getFloat(&random.m_rnd);
                retVal.m_data[lVar46] = fVar62;
                lVar46 = lVar46 + 1;
              } while (lVar46 != 4);
              goto LAB_00969db9;
            }
          }
          AttributePack::newArray(local_2b8->m_glArrayPack,STORAGE_USER);
          AttributePack::newArray(local_2b8->m_rrArrayPack,STORAGE_USER);
          ppAVar7 = (local_2b8->m_glArrayPack->m_arrays).
                    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(local_2b8->m_glArrayPack->m_arrays).
                            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >> 3) <=
              uVar49) {
LAB_0096b170:
            uVar28 = std::__throw_out_of_range_fmt
                               (
                               "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               );
            if ((DrawTest *)attribSpec._0_8_ != pDVar56) {
              operator_delete((void *)attribSpec._0_8_,attribSpec._16_8_ + 1);
            }
            anon_unknown_1::IterationLogSectionEmitter::~IterationLogSectionEmitter(&sectionEmitter)
            ;
            _Unwind_Resume(uVar28);
          }
          pAVar27 = ppAVar7[uVar49];
          pAVar27->m_componentCount = attribSpec.componentCount;
          pAVar27->m_bound = false;
          pAVar27->m_inputType = IVar51;
          pAVar27->m_outputType = attribSpec.outputType;
          pAVar27->m_normalize = false;
          pAVar27->m_stride = 0;
          pAVar27->m_offset = 0;
          (pAVar27->m_defaultAttrib).v.uData[0] = (deUint32)fVar62;
          (pAVar27->m_defaultAttrib).v.uData[1] = (deUint32)pDVar56;
          (pAVar27->m_defaultAttrib).v.uData[2] = (deUint32)fVar63;
          (pAVar27->m_defaultAttrib).v.uData[3] = (deUint32)fVar50;
          pAVar27->m_instanceDivisor = 0;
          pAVar27->m_isPositionAttr = (bool)(local_2a9 & 1);
          pAVar27->m_bgraOrder = false;
          ppAVar7 = (local_2b8->m_rrArrayPack->m_arrays).
                    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(local_2b8->m_rrArrayPack->m_arrays).
                            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >> 3) <=
              uVar49) goto LAB_0096b170;
          pAVar27 = ppAVar7[uVar49];
          pAVar27->m_componentCount = attribSpec.componentCount;
          pAVar27->m_bound = false;
          pAVar27->m_inputType = IVar51;
          pAVar27->m_outputType = attribSpec.outputType;
          pAVar27->m_normalize = false;
          pAVar27->m_stride = 0;
          pAVar27->m_offset = 0;
          (pAVar27->m_defaultAttrib).v.uData[0] = (deUint32)fVar62;
          (pAVar27->m_defaultAttrib).v.uData[1] = (deUint32)pDVar56;
          (pAVar27->m_defaultAttrib).v.uData[2] = (deUint32)fVar63;
          (pAVar27->m_defaultAttrib).v.uData[3] = (deUint32)fVar50;
          pAVar27->m_instanceDivisor = 0;
          pAVar27->m_isPositionAttr = (bool)(local_2a9 & 1);
          pAVar27->m_bgraOrder = false;
        }
        else {
          iVar10 = attribSpec.componentCount;
          lVar46 = (long)attribSpec.componentCount;
          local_250 = (char *)(long)(DrawTestSpec::inputTypeSize::size[(int)attribSpec.inputType] *
                                    attribSpec.componentCount);
          local_2d0 = (char *)(long)attribSpec.stride;
          if ((char *)(long)attribSpec.stride == (char *)0x0) {
            local_2d0 = local_250;
          }
          local_2e8 = uVar48;
          if ((0 < attribSpec.instanceDivisor & (byte)(uVar52 >> 8)) == 1) {
            local_2e8 = (ulong)(local_2a8->instanceCount / attribSpec.instanceDivisor + 1);
          }
          if (((uVar52 >> 0x10 & 1) != 0) &&
             (uVar26 = (ulong)(local_2a8->indexMax + 1), local_2e8 <= uVar26)) {
            local_2e8 = uVar26;
          }
          dVar22 = iVar14 + (int)uVar49 + iVar16 * 100;
          local_2d8 = (long)attribSpec.offset;
          if ((attribSpec.inputType & ~INPUTTYPE_FIXED) == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
            local_2c0 = (char *)operator_new__((long)(((int)local_2e8 + -1) * (int)local_2d0 +
                                                     attribSpec.offset) + 4);
            deRandom_init(&random.m_rnd,dVar22);
            if (0 < (int)local_2e8) {
              puVar57 = (uint *)(local_2c0 + local_2d8);
              uVar26 = local_2e8 & 0xffffffff;
              do {
                dVar22 = deRandom_getUint32(&random.m_rnd);
                dVar17 = deRandom_getUint32(&random.m_rnd);
                dVar18 = deRandom_getUint32(&random.m_rnd);
                dVar19 = deRandom_getUint32(&random.m_rnd);
                *puVar57 = (dVar17 & 0x3ff) << 10 | (dVar18 & 0x3ff) << 0x14 | dVar19 << 0x1e |
                           dVar22 & 0x3ff;
                puVar57 = (uint *)((long)puVar57 + (long)local_2d0);
                uVar41 = (int)uVar26 - 1;
                uVar26 = (ulong)uVar41;
              } while (uVar41 != 0);
            }
          }
          else if (attribSpec.inputType < INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
            uVar26 = (ulong)(uint)attribSpec.componentCount;
            switch(attribSpec._0_8_ & 0xffffffff) {
            case 0:
              GVar65 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_FLOAT);
              GVar66 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_FLOAT);
              local_2c0 = (char *)operator_new__((long)(((int)local_2e8 + -1) * (int)local_2d0 +
                                                       (int)local_2d8) + lVar46 * 4);
              deRandom_init((deRandom *)&retVal,dVar22);
              if (0 < (int)local_2e8) {
                pcVar60 = local_2c0 + local_2d8;
                local_2a0.fl.m_value = (Float)(Float)GVar66.field_1._0_4_;
                local_2e0 = (char *)CONCAT44(local_2e0._4_4_,GVar65.type);
                fVar62 = GVar66.field_1._0_4_ - (float)GVar65.type;
                iVar14 = 0;
                do {
                  if (0 < iVar10) {
                    uVar43 = 0;
                    do {
                      fVar63 = local_2e0._0_4_;
                      if (local_2e0._0_4_ <= (float)local_2a0._0_4_) {
                        fVar63 = deRandom_getFloat((deRandom *)&retVal);
                        fVar63 = fVar63 * fVar62 + local_2e0._0_4_;
                      }
                      (&rnd_4.x)[uVar43] = (deUint32)fVar63;
                      if ((iVar14 != 0) && (ABS(fVar63 - (float)(&random.m_rnd.x)[uVar43]) < 4.0)) {
                        fVar63 = local_2e0._0_4_;
                        if (local_2e0._0_4_ <= (float)local_2a0._0_4_) {
                          fVar63 = deRandom_getFloat((deRandom *)&retVal);
                          fVar63 = fVar63 * fVar62 + local_2e0._0_4_;
                        }
                        (&rnd_4.x)[uVar43] = (deUint32)fVar63;
                      }
                      uVar43 = uVar43 + 1;
                    } while (uVar26 != uVar43);
                    memcpy(&random,&rnd_4,uVar26 * 4);
                    memcpy(pcVar60,&rnd_4,uVar26 * 4);
                  }
                  pcVar60 = pcVar60 + (long)local_2d0;
                  iVar14 = iVar14 + 1;
                } while (iVar14 != (int)local_2e8);
              }
              break;
            case 1:
              GVar65 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_FIXED);
              GVar66 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_FIXED);
              local_2c0 = (char *)operator_new__((long)(((int)local_2e8 + -1) * (int)local_2d0 +
                                                       (int)local_2d8) + lVar46 * 4);
              deRandom_init((deRandom *)&retVal,dVar22);
              if (0 < (int)local_2e8) {
                aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)local_2c0 + local_2d8);
                iVar14 = GVar66.field_1._0_4_;
                IVar51 = GVar65.type;
                local_2e0 = (char *)(uVar26 * 4);
                iVar16 = 0;
                do {
                  if (0 < iVar10) {
                    uVar43 = 0;
                    local_2a0 = aVar45;
                    do {
                      IVar39 = IVar51;
                      if ((int)IVar51 < iVar14) {
                        dVar22 = deRandom_getUint32((deRandom *)&retVal);
                        IVar39 = dVar22 % (iVar14 - IVar51) + IVar51;
                      }
                      (&rnd_4.x)[uVar43] = IVar39;
                      if ((iVar16 != 0) && ((IVar39 - (&random.m_rnd.x)[uVar43] & 0x7ffc) == 0)) {
                        IVar39 = IVar51;
                        if ((int)IVar51 < iVar14) {
                          dVar22 = deRandom_getUint32((deRandom *)&retVal);
                          IVar39 = dVar22 % (iVar14 - IVar51) + IVar51;
                        }
                        (&rnd_4.x)[uVar43] = IVar39;
                      }
                      uVar43 = uVar43 + 1;
                    } while (uVar26 != uVar43);
                    memcpy(&random,&rnd_4,(size_t)local_2e0);
                    aVar45 = local_2a0;
                    memcpy((void *)local_2a0,&rnd_4,(size_t)local_2e0);
                  }
                  aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar45 + (long)local_2d0);
                  iVar16 = iVar16 + 1;
                } while (iVar16 != (int)local_2e8);
              }
              break;
            case 2:
              GVar65 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_DOUBLE);
              GVar66 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_DOUBLE);
              local_2c0 = (char *)operator_new__((long)(((int)local_2e8 + -1) * (int)local_2d0 +
                                                       (int)local_2d8) + lVar46 * 8);
              deRandom_init(&rnd_4,dVar22);
              if (0 < (int)local_2e8) {
                pcVar60 = local_2c0 + local_2d8;
                fVar62 = (float)(double)GVar66.field_1 - (float)(double)GVar65._0_8_;
                iVar14 = 0;
                local_2e0 = GVar65._0_8_;
                local_2a0 = GVar66.field_1;
                do {
                  if (0 < iVar10) {
                    uVar43 = 0;
                    do {
                      pcVar64 = local_2e0;
                      if ((double)local_2e0 <= (double)local_2a0) {
                        fVar63 = deRandom_getFloat(&rnd_4);
                        pcVar64 = (char *)((double)(fVar63 * fVar62) + (double)local_2e0);
                      }
                      *(char **)(retVal.m_data + uVar43 * 2) = pcVar64;
                      if ((iVar14 != 0) &&
                         (ABS((float)((double)pcVar64 - *(double *)(&random.m_rnd.x + uVar43 * 2)))
                          < 4.0)) {
                        pcVar64 = local_2e0;
                        if ((double)local_2e0 <= (double)local_2a0) {
                          fVar63 = deRandom_getFloat(&rnd_4);
                          pcVar64 = (char *)((double)(fVar63 * fVar62) + (double)local_2e0);
                        }
                        *(char **)(retVal.m_data + uVar43 * 2) = pcVar64;
                      }
                      uVar43 = uVar43 + 1;
                    } while (uVar26 != uVar43);
                    memcpy(&random,&retVal,uVar26 * 8);
                    memcpy(pcVar60,&retVal,uVar26 * 8);
                  }
                  pcVar60 = pcVar60 + (long)local_2d0;
                  iVar14 = iVar14 + 1;
                } while (iVar14 != (int)local_2e8);
              }
              break;
            case 3:
              GVar65 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_BYTE);
              GVar66 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_BYTE);
              local_2c0 = (char *)operator_new__((((int)local_2e8 + -1) * (int)local_2d0 +
                                                 (int)local_2d8) + lVar46);
              deRandom_init(&random.m_rnd,dVar22);
              if (0 < (int)local_2e8) {
                pcVar60 = local_2c0 + local_2d8;
                cVar58 = GVar66.field_1._0_1_;
                cVar53 = (char)GVar65.type;
                iVar14 = 0;
                do {
                  if (0 < iVar10) {
                    uVar43 = 0;
                    local_2e0 = pcVar60;
                    do {
                      cVar33 = cVar53;
                      if (cVar53 < cVar58) {
                        dVar22 = deRandom_getUint32(&random.m_rnd);
                        cVar33 = (char)(dVar22 % (uint)((int)cVar58 - (int)cVar53)) + cVar53;
                      }
                      *(char *)((long)&rnd_4.x + uVar43) = cVar33;
                      if ((iVar14 != 0) &&
                         ((cVar33 - *(char *)((long)retVal.m_data + uVar43) & 0x7cU) == 0)) {
                        cVar33 = cVar53;
                        if (cVar53 < cVar58) {
                          dVar22 = deRandom_getUint32(&random.m_rnd);
                          cVar33 = (char)(dVar22 % (uint)((int)cVar58 - (int)cVar53)) + cVar53;
                        }
                        *(char *)((long)&rnd_4.x + uVar43) = cVar33;
                      }
                      uVar43 = uVar43 + 1;
                    } while (uVar26 != uVar43);
                    memcpy(&retVal,&rnd_4,uVar26);
                    pcVar60 = local_2e0;
                    memcpy(local_2e0,&rnd_4,uVar26);
                  }
                  pcVar60 = pcVar60 + (long)local_2d0;
                  iVar14 = iVar14 + 1;
                } while (iVar14 != (int)local_2e8);
              }
              break;
            case 4:
              GVar65 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_SHORT);
              GVar66 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_SHORT);
              local_2c0 = (char *)operator_new__((long)(((int)local_2e8 + -1) * (int)local_2d0 +
                                                       (int)local_2d8) + lVar46 * 2);
              deRandom_init(&random.m_rnd,dVar22);
              if (0 < (int)local_2e8) {
                aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)local_2c0 + local_2d8);
                sVar59 = GVar66.field_1._0_2_;
                sVar54 = (short)GVar65.type;
                local_2e0 = (char *)(uVar26 * 2);
                iVar14 = 0;
                do {
                  if (0 < iVar10) {
                    uVar43 = 0;
                    local_2a0 = aVar45;
                    do {
                      sVar36 = sVar54;
                      if (sVar54 < sVar59) {
                        dVar22 = deRandom_getUint32(&random.m_rnd);
                        sVar36 = (short)(dVar22 % (uint)((int)sVar59 - (int)sVar54)) + sVar54;
                      }
                      *(short *)((long)&rnd_4.x + uVar43 * 2) = sVar36;
                      if ((iVar14 != 0) &&
                         ((sVar36 - *(short *)((long)retVal.m_data + uVar43 * 2) & 0x7c00U) == 0)) {
                        sVar36 = sVar54;
                        if (sVar54 < sVar59) {
                          dVar22 = deRandom_getUint32(&random.m_rnd);
                          sVar36 = (short)(dVar22 % (uint)((int)sVar59 - (int)sVar54)) + sVar54;
                        }
                        *(short *)((long)&rnd_4.x + uVar43 * 2) = sVar36;
                      }
                      uVar43 = uVar43 + 1;
                    } while (uVar26 != uVar43);
                    memcpy(&retVal,&rnd_4,(size_t)local_2e0);
                    aVar45 = local_2a0;
                    memcpy((void *)local_2a0,&rnd_4,(size_t)local_2e0);
                  }
                  aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar45 + (long)local_2d0);
                  iVar14 = iVar14 + 1;
                } while (iVar14 != (int)local_2e8);
              }
              break;
            case 5:
              GVar65 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_UNSIGNED_BYTE);
              GVar66 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_BYTE);
              local_2c0 = (char *)operator_new__((((int)local_2e8 + -1) * (int)local_2d0 +
                                                 (int)local_2d8) + lVar46);
              deRandom_init(&random.m_rnd,dVar22);
              if (0 < (int)local_2e8) {
                pcVar60 = local_2c0 + local_2d8;
                uVar41 = (GVar66.field_1._0_4_ & 0xff) - (GVar65.type & 0xff);
                iVar14 = 0;
                do {
                  if (0 < iVar10) {
                    uVar43 = 0;
                    local_2e0 = pcVar60;
                    do {
                      bVar35 = (byte)GVar65.type;
                      bVar34 = bVar35;
                      if (bVar35 < GVar66.field_1._0_1_) {
                        dVar22 = deRandom_getUint32(&random.m_rnd);
                        bVar34 = (char)(dVar22 % uVar41) + bVar35;
                      }
                      *(byte *)((long)&rnd_4.x + uVar43) = bVar34;
                      if ((iVar14 != 0) &&
                         ((byte)(bVar34 - *(char *)((long)retVal.m_data + uVar43)) < 8)) {
                        if (bVar35 < GVar66.field_1._0_1_) {
                          dVar22 = deRandom_getUint32(&random.m_rnd);
                          bVar35 = (char)(dVar22 % uVar41) + bVar35;
                        }
                        *(byte *)((long)&rnd_4.x + uVar43) = bVar35;
                      }
                      uVar43 = uVar43 + 1;
                    } while (uVar26 != uVar43);
                    memcpy(&retVal,&rnd_4,uVar26);
                    pcVar60 = local_2e0;
                    memcpy(local_2e0,&rnd_4,uVar26);
                  }
                  pcVar60 = pcVar60 + (long)local_2d0;
                  iVar14 = iVar14 + 1;
                } while (iVar14 != (int)local_2e8);
              }
              break;
            case 6:
              GVar65 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_UNSIGNED_SHORT);
              GVar66 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_SHORT);
              local_2c0 = (char *)operator_new__((long)(((int)local_2e8 + -1) * (int)local_2d0 +
                                                       (int)local_2d8) + lVar46 * 2);
              deRandom_init(&random.m_rnd,dVar22);
              if (0 < (int)local_2e8) {
                aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)local_2c0 + local_2d8);
                uVar41 = (GVar66.field_1._0_4_ & 0xffff) - (GVar65.type & 0xffff);
                local_2e0 = (char *)(uVar26 * 2);
                iVar14 = 0;
                do {
                  if (0 < iVar10) {
                    uVar43 = 0;
                    local_2a0 = aVar45;
                    do {
                      uVar38 = (ushort)GVar65.type;
                      uVar37 = uVar38;
                      if (uVar38 < GVar66.field_1._0_2_) {
                        dVar22 = deRandom_getUint32(&random.m_rnd);
                        uVar37 = (short)(dVar22 % uVar41) + uVar38;
                      }
                      *(ushort *)((long)&rnd_4.x + uVar43 * 2) = uVar37;
                      if ((iVar14 != 0) &&
                         ((ushort)(uVar37 - *(short *)((long)retVal.m_data + uVar43 * 2)) < 0x400))
                      {
                        if (uVar38 < GVar66.field_1._0_2_) {
                          dVar22 = deRandom_getUint32(&random.m_rnd);
                          uVar38 = (short)(dVar22 % uVar41) + uVar38;
                        }
                        *(ushort *)((long)&rnd_4.x + uVar43 * 2) = uVar38;
                      }
                      uVar43 = uVar43 + 1;
                    } while (uVar26 != uVar43);
                    memcpy(&retVal,&rnd_4,(size_t)local_2e0);
                    aVar45 = local_2a0;
                    memcpy((void *)local_2a0,&rnd_4,(size_t)local_2e0);
                  }
                  aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar45 + (long)local_2d0);
                  iVar14 = iVar14 + 1;
                } while (iVar14 != (int)local_2e8);
              }
              break;
            case 7:
              GVar65 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_INT);
              GVar66 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_INT);
              local_2c0 = (char *)operator_new__((long)(((int)local_2e8 + -1) * (int)local_2d0 +
                                                       (int)local_2d8) + lVar46 * 4);
              deRandom_init((deRandom *)&retVal,dVar22);
              if (0 < (int)local_2e8) {
                aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)local_2c0 + local_2d8);
                iVar14 = GVar66.field_1._0_4_;
                IVar51 = GVar65.type;
                local_2e0 = (char *)(uVar26 * 4);
                iVar16 = 0;
                do {
                  if (0 < iVar10) {
                    uVar43 = 0;
                    local_2a0 = aVar45;
                    do {
                      IVar39 = IVar51;
                      if ((int)IVar51 < iVar14) {
                        dVar22 = deRandom_getUint32((deRandom *)&retVal);
                        IVar39 = dVar22 % (iVar14 - IVar51) + IVar51;
                      }
                      (&rnd_4.x)[uVar43] = IVar39;
                      if ((iVar16 != 0) && ((IVar39 - (&random.m_rnd.x)[uVar43] & 0x7c000000) == 0))
                      {
                        IVar39 = IVar51;
                        if ((int)IVar51 < iVar14) {
                          dVar22 = deRandom_getUint32((deRandom *)&retVal);
                          IVar39 = dVar22 % (iVar14 - IVar51) + IVar51;
                        }
                        (&rnd_4.x)[uVar43] = IVar39;
                      }
                      uVar43 = uVar43 + 1;
                    } while (uVar26 != uVar43);
                    memcpy(&random,&rnd_4,(size_t)local_2e0);
                    aVar45 = local_2a0;
                    memcpy((void *)local_2a0,&rnd_4,(size_t)local_2e0);
                  }
                  aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar45 + (long)local_2d0);
                  iVar16 = iVar16 + 1;
                } while (iVar16 != (int)local_2e8);
              }
              break;
            case 8:
              GVar65 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_UNSIGNED_INT);
              GVar66 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_INT);
              local_2c0 = (char *)operator_new__((long)(((int)local_2e8 + -1) * (int)local_2d0 +
                                                       (int)local_2d8) + lVar46 * 4);
              deRandom_init((deRandom *)&retVal,dVar22);
              if (0 < (int)local_2e8) {
                aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)local_2c0 + local_2d8);
                IVar51 = GVar66.field_1._0_4_;
                IVar39 = GVar65.type;
                local_2e0 = (char *)((ulong)(uint)iVar10 * 4);
                iVar14 = 0;
                do {
                  if (0 < iVar10) {
                    uVar26 = 0;
                    local_2a0 = aVar45;
                    do {
                      IVar40 = IVar39;
                      if (IVar39 < IVar51) {
                        dVar22 = deRandom_getUint32((deRandom *)&retVal);
                        IVar40 = dVar22 % (IVar51 - IVar39) + IVar39;
                      }
                      (&rnd_4.x)[uVar26] = IVar40;
                      if ((iVar14 != 0) && (IVar40 - (&random.m_rnd.x)[uVar26] < 0x4000000)) {
                        IVar40 = IVar39;
                        if (IVar39 < IVar51) {
                          dVar22 = deRandom_getUint32((deRandom *)&retVal);
                          IVar40 = dVar22 % (IVar51 - IVar39) + IVar39;
                        }
                        (&rnd_4.x)[uVar26] = IVar40;
                      }
                      uVar26 = uVar26 + 1;
                    } while ((uint)iVar10 != uVar26);
                    memcpy(&random,&rnd_4,(size_t)local_2e0);
                    aVar45 = local_2a0;
                    memcpy((void *)local_2a0,&rnd_4,(size_t)local_2e0);
                  }
                  aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar45 + (long)local_2d0);
                  iVar14 = iVar14 + 1;
                } while (iVar14 != (int)local_2e8);
              }
              break;
            case 9:
              GVar65 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_HALF);
              GVar66 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_HALF);
              local_2c0 = (char *)operator_new__((long)(((int)local_2e8 + -1) * (int)local_2d0 +
                                                       (int)local_2d8) + lVar46 * 2);
              deRandom_init(&random.m_rnd,dVar22);
              if (0 < (int)local_2e8) {
                pcVar60 = local_2c0 + local_2d8;
                local_2a0._4_4_ = 0;
                local_2a0.fl.m_value = (Float)(Float)iVar10;
                __n = (long)local_2a0 * 2;
                local_2e0 = (char *)((ulong)local_2e0 & 0xffffffff00000000);
                do {
                  if (0 < iVar10) {
                    aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)0x0;
                    do {
                      uVar55 = GVar66.field_1._0_2_;
                      local_2ec.m_value._0_2_ = uVar55;
                      FVar20 = tcu::Float<unsigned_int,8,23,127,3u>::
                               convert<unsigned_short,5,10,15,3u>
                                         ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                      FVar13.m_value = GVar65.type._0_2_;
                      local_2ec.m_value._0_2_ = FVar13.m_value;
                      FVar21 = tcu::Float<unsigned_int,8,23,127,3u>::
                               convert<unsigned_short,5,10,15,3u>
                                         ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                      FVar11.m_value = FVar13.m_value;
                      if ((float)FVar21.m_value <= (float)FVar20.m_value) {
                        local_2ec.m_value._0_2_ = uVar55;
                        FVar20 = tcu::Float<unsigned_int,8,23,127,3u>::
                                 convert<unsigned_short,5,10,15,3u>
                                           ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                        local_2ec.m_value._0_2_ = FVar13.m_value;
                        FVar21 = tcu::Float<unsigned_int,8,23,127,3u>::
                                 convert<unsigned_short,5,10,15,3u>
                                           ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                        fVar62 = deRandom_getFloat(&random.m_rnd);
                        local_2ec.m_value =
                             (StorageType)
                             (fVar62 * ((float)FVar20.m_value - (float)FVar21.m_value) +
                             FVar21.m_value);
                        FVar11 = tcu::Float<unsigned_short,5,10,15,1u>::
                                 convert<unsigned_int,8,23,127,3u>(&local_2ec);
                      }
                      *(StorageType_conflict *)((long)&rnd_4.x + (long)aVar45 * 2) = FVar11.m_value;
                      if (local_2e0._0_4_ != 0.0) {
                        local_2ec.m_value._0_2_ = FVar11.m_value;
                        FVar20 = tcu::Float<unsigned_int,8,23,127,3u>::
                                 convert<unsigned_short,5,10,15,3u>
                                           ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                        local_2ec.m_value._0_2_ =
                             *(undefined2 *)((long)retVal.m_data + (long)aVar45 * 2);
                        local_2ec = tcu::Float<unsigned_int,8,23,127,3u>::
                                    convert<unsigned_short,5,10,15,3u>
                                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                        local_2ec.m_value = (StorageType)(FVar20.m_value - local_2ec.m_value);
                        FVar11 = tcu::Float<unsigned_short,5,10,15,1u>::
                                 convert<unsigned_int,8,23,127,3u>(&local_2ec);
                        local_2ec.m_value._0_2_ = FVar11.m_value;
                        local_2ec = tcu::Float<unsigned_int,8,23,127,3u>::
                                    convert<unsigned_short,5,10,15,3u>
                                              ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                        local_2ec.m_value = local_2ec.m_value & 0x7fffffff;
                        FVar11 = tcu::Float<unsigned_short,5,10,15,1u>::
                                 convert<unsigned_int,8,23,127,3u>(&local_2ec);
                        local_2ec.m_value = 0x40800000;
                        FVar12 = tcu::Float<unsigned_short,5,10,15,1u>::
                                 convert<unsigned_int,8,23,127,3u>(&local_2ec);
                        local_2ec.m_value._0_2_ = FVar11;
                        FVar20 = tcu::Float<unsigned_int,8,23,127,3u>::
                                 convert<unsigned_short,5,10,15,3u>
                                           ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                        local_2ec.m_value._0_2_ = FVar12.m_value;
                        FVar21 = tcu::Float<unsigned_int,8,23,127,3u>::
                                 convert<unsigned_short,5,10,15,3u>
                                           ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                        if ((float)FVar20.m_value < (float)FVar21.m_value) {
                          local_2ec.m_value._0_2_ = uVar55;
                          FVar20 = tcu::Float<unsigned_int,8,23,127,3u>::
                                   convert<unsigned_short,5,10,15,3u>
                                             ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                          local_2ec.m_value._0_2_ = FVar13.m_value;
                          FVar21 = tcu::Float<unsigned_int,8,23,127,3u>::
                                   convert<unsigned_short,5,10,15,3u>
                                             ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                          if ((float)FVar21.m_value <= (float)FVar20.m_value) {
                            local_2ec.m_value._0_2_ = uVar55;
                            FVar20 = tcu::Float<unsigned_int,8,23,127,3u>::
                                     convert<unsigned_short,5,10,15,3u>
                                               ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                            local_2ec.m_value._0_2_ = FVar13.m_value;
                            FVar21 = tcu::Float<unsigned_int,8,23,127,3u>::
                                     convert<unsigned_short,5,10,15,3u>
                                               ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_2ec);
                            fVar62 = deRandom_getFloat(&random.m_rnd);
                            local_2ec.m_value =
                                 (StorageType)
                                 (fVar62 * ((float)FVar20.m_value - (float)FVar21.m_value) +
                                 FVar21.m_value);
                            FVar13 = tcu::Float<unsigned_short,5,10,15,1u>::
                                     convert<unsigned_int,8,23,127,3u>(&local_2ec);
                          }
                          *(StorageType_conflict *)((long)&rnd_4.x + (long)aVar45 * 2) =
                               FVar13.m_value;
                        }
                      }
                      aVar45 = (anon_union_8_10_1f5805e9_for_GLValue_1)((long)aVar45 + 1);
                    } while (local_2a0 != aVar45);
                    memcpy(&retVal,&rnd_4,__n);
                    memcpy(pcVar60,&rnd_4,__n);
                  }
                  pcVar60 = pcVar60 + (long)local_2d0;
                  iVar14 = (int)local_2e0._0_4_ + 1;
                  local_2e0 = (char *)CONCAT44(local_2e0._4_4_,iVar14);
                } while (iVar14 != (int)local_2e8);
              }
            }
          }
          else {
            local_2c0 = (char *)0x0;
          }
          pcVar60 = local_250;
          pDVar56 = local_2b8;
          lVar46 = local_2d8;
          storage = attribSpec.storage;
          AttributePack::newArray(local_2b8->m_glArrayPack,attribSpec.storage);
          AttributePack::newArray(pDVar56->m_rrArrayPack,storage);
          uVar28 = attribSpec._8_8_;
          ppAVar7 = (pDVar56->m_glArrayPack->m_arrays).
                    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(pDVar56->m_glArrayPack->m_arrays).
                            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >> 3) <=
              uVar49) {
LAB_0096b162:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_0096b170;
          }
          lVar32 = (local_2e8 - 1) * (long)local_2d0;
          usage = attribSpec.usage;
          anon_unknown_1::AttributeArray::data
                    (ppAVar7[uVar49],TARGET_ARRAY,(size_t)(pcVar60 + lVar32 + lVar46),local_2c0,
                     attribSpec.usage);
          ppAVar7 = (local_2b8->m_rrArrayPack->m_arrays).
                    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(local_2b8->m_rrArrayPack->m_arrays).
                            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >> 3) <=
              uVar49) goto LAB_0096b162;
          anon_unknown_1::AttributeArray::data
                    (ppAVar7[uVar49],TARGET_ARRAY,(size_t)(pcVar60 + lVar32 + lVar46),local_2c0,
                     usage);
          ppAVar7 = (local_2b8->m_glArrayPack->m_arrays).
                    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(local_2b8->m_glArrayPack->m_arrays).
                            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >> 3) <=
              uVar49) goto LAB_0096b162;
          pAVar27 = ppAVar7[uVar49];
          pDVar56 = (DrawTest *)((ulong)CONCAT31(SUB83(uVar28,5),local_2a9) & 0xffffffffffffff01);
          pAVar27->m_componentCount = attribSpec.componentCount;
          pAVar27->m_bound = true;
          pAVar27->m_inputType = attribSpec.inputType;
          pAVar27->m_outputType = attribSpec.outputType;
          pAVar27->m_normalize = attribSpec.normalize;
          pAVar27->m_stride = attribSpec.stride;
          pAVar27->m_offset = attribSpec.offset;
          *(undefined8 *)&(pAVar27->m_defaultAttrib).v = 0;
          *(undefined8 *)((long)&(pAVar27->m_defaultAttrib).v + 8) = 0;
          pAVar27->m_instanceDivisor = attribSpec.instanceDivisor;
          pAVar27->m_isPositionAttr = SUB81(pDVar56,0);
          pAVar27->m_bgraOrder = attribSpec.bgraComponentOrder;
          ppAVar7 = (local_2b8->m_rrArrayPack->m_arrays).
                    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(local_2b8->m_rrArrayPack->m_arrays).
                            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar7 >> 3) <=
              uVar49) goto LAB_0096b162;
          pAVar27 = ppAVar7[uVar49];
          pAVar27->m_componentCount = attribSpec.componentCount;
          pAVar27->m_bound = true;
          pAVar27->m_inputType = attribSpec.inputType;
          pAVar27->m_outputType = attribSpec.outputType;
          pAVar27->m_normalize = attribSpec.normalize;
          pAVar27->m_stride = attribSpec.stride;
          pAVar27->m_offset = attribSpec.offset;
          *(undefined8 *)&(pAVar27->m_defaultAttrib).v = 0;
          *(undefined8 *)((long)&(pAVar27->m_defaultAttrib).v + 8) = 0;
          pAVar27->m_instanceDivisor = attribSpec.instanceDivisor;
          pAVar27->m_isPositionAttr = SUB81(pDVar56,0);
          pAVar27->m_bgraOrder = attribSpec.bgraComponentOrder;
          if (local_2c0 != (char *)0x0) {
            operator_delete__(local_2c0);
          }
        }
        uVar49 = uVar49 + 1;
        pAVar25 = (local_2a8->attribs).
                  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while ((long)uVar49 <
               (long)((int)((ulong)((long)(local_2a8->attribs).
                                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar25
                                   ) >> 3) * -0x33333333));
    }
    if (bVar61) {
      AttributePack::updateProgram(local_2b8->m_glArrayPack);
      AttributePack::updateProgram(local_2b8->m_rrArrayPack);
    }
    pDVar9 = local_2a8;
    if ((uVar52 & 1) == 0) {
      AttributePack::render
                (local_2b8->m_glArrayPack,local_2a8->primitive,local_2a8->drawMethod,
                 local_2a8->first,vertexCount,INDEXTYPE_LAST,(void *)0x0,0,0,
                 local_2a8->instanceCount,local_2a8->indirectOffset,0,coordScale,colorScale,
                 (AttributeArray *)0x0);
      AttributePack::render
                (local_2b8->m_rrArrayPack,pDVar9->primitive,pDVar9->drawMethod,pDVar9->first,
                 vertexCount,INDEXTYPE_LAST,(void *)0x0,0,0,pDVar9->instanceCount,
                 pDVar9->indirectOffset,0,coordScale,colorScale,(AttributeArray *)0x0);
    }
    else {
      dVar22 = DrawTestSpec::hash(local_2a8);
      IVar4 = pDVar9->indexType;
      local_2a0 = (anon_union_8_10_1f5805e9_for_GLValue_1)
                  (long)DrawTestSpec::indexTypeSize::size[(int)IVar4];
      local_2e0 = (char *)(long)pDVar9->indexPointerOffset;
      uVar52 = (uint)uVar48;
      if ((long)(int)IVar4 == 2) {
        local_2d0 = (char *)operator_new__((ulong)(local_2e0 + (long)(int)uVar52 * 4));
        deRandom_init(&random.m_rnd,dVar22);
        pcVar60 = local_2d0;
        if (0 < (int)uVar52) {
          pcVar64 = local_2d0 + (long)local_2e0;
          uVar44 = local_2c4 - uVar29;
          uVar49 = 0;
          uVar41 = 0xffffffff;
          uVar30 = 0xffffffff;
          do {
            uVar23 = uVar41;
            uVar41 = uVar29;
            if (uVar29 < local_2c4) {
              dVar22 = deRandom_getUint32(&random.m_rnd);
              uVar41 = dVar22 % uVar44 + uVar29;
            }
            uVar41 = (uVar41 == uVar23) + uVar41;
            uVar24 = uVar29;
            if (uVar41 <= local_2c4) {
              uVar24 = uVar41;
            }
            uVar24 = (uVar24 == uVar30) + uVar24;
            uVar30 = uVar29;
            if (uVar24 <= local_2c4) {
              uVar30 = uVar24;
            }
            uVar30 = (uVar30 == uVar23) + uVar30;
            uVar41 = uVar29;
            if (uVar30 <= local_2c4) {
              uVar41 = uVar30;
            }
            *(uint *)(pcVar64 + uVar49 * 4) = uVar3 + uVar41;
            uVar49 = uVar49 + 1;
            pcVar60 = local_2d0;
            uVar30 = uVar23;
          } while ((uVar52 & 0x7fffffff) != uVar49);
        }
      }
      else if (IVar4 == INDEXTYPE_SHORT) {
        local_2d0 = (char *)operator_new__((ulong)(local_2e0 + (long)(int)uVar52 * 2));
        deRandom_init(&random.m_rnd,dVar22);
        pcVar60 = local_2d0;
        if (0 < (int)uVar52) {
          pcVar64 = local_2d0 + (long)local_2e0;
          uVar44 = local_2c4 - uVar29;
          uVar49 = 0;
          uVar41 = 0xffffffff;
          uVar30 = 0xffffffff;
          do {
            uVar23 = uVar41;
            uVar41 = uVar29;
            if (uVar29 < local_2c4) {
              dVar22 = deRandom_getUint32(&random.m_rnd);
              uVar41 = dVar22 % uVar44 + uVar29;
            }
            uVar41 = (uVar41 == uVar23) + uVar41;
            uVar24 = uVar29;
            if (uVar41 <= local_2c4) {
              uVar24 = uVar41;
            }
            uVar24 = (uVar24 == uVar30) + uVar24;
            uVar30 = uVar29;
            if (uVar24 <= local_2c4) {
              uVar30 = uVar24;
            }
            uVar30 = (uVar30 == uVar23) + uVar30;
            uVar41 = uVar29;
            if (uVar30 <= local_2c4) {
              uVar41 = uVar30;
            }
            *(short *)(pcVar64 + uVar49 * 2) = (short)uVar3 + (short)uVar41;
            uVar49 = uVar49 + 1;
            pcVar60 = local_2d0;
            uVar30 = uVar23;
          } while ((uVar52 & 0x7fffffff) != uVar49);
        }
      }
      else if (IVar4 == INDEXTYPE_BYTE) {
        local_2d0 = (char *)operator_new__((ulong)(local_2e0 + (int)uVar52));
        deRandom_init(&random.m_rnd,dVar22);
        pcVar60 = local_2d0;
        if (0 < (int)uVar52) {
          pcVar64 = local_2d0 + (long)local_2e0;
          uVar44 = local_2c4 - uVar29;
          uVar49 = 0;
          uVar41 = 0xffffffff;
          uVar30 = 0xffffffff;
          do {
            uVar23 = uVar41;
            uVar41 = uVar29;
            if (uVar29 < local_2c4) {
              dVar22 = deRandom_getUint32(&random.m_rnd);
              uVar41 = dVar22 % uVar44 + uVar29;
            }
            uVar41 = (uVar41 == uVar23) + uVar41;
            uVar24 = uVar29;
            if (uVar41 <= local_2c4) {
              uVar24 = uVar41;
            }
            uVar24 = (uVar24 == uVar30) + uVar24;
            uVar30 = uVar29;
            if (uVar24 <= local_2c4) {
              uVar30 = uVar24;
            }
            uVar30 = (uVar30 == uVar23) + uVar30;
            uVar41 = uVar29;
            if (uVar30 <= local_2c4) {
              uVar41 = uVar30;
            }
            pcVar64[uVar49] = (char)uVar3 + (char)uVar41;
            uVar49 = uVar49 + 1;
            pcVar60 = local_2d0;
            uVar30 = uVar23;
          } while ((uVar52 & 0x7fffffff) != uVar49);
        }
      }
      else {
        pcVar60 = (char *)0x0;
      }
      pDVar9 = local_2a8;
      pcVar64 = (char *)0x0;
      if (local_2a8->indexStorage == STORAGE_USER) {
        pcVar64 = pcVar60;
      }
      iVar14 = local_2a8->indexPointerOffset;
      pAVar27 = (AttributeArray *)operator_new(0x58);
      anon_unknown_1::AttributeArray::AttributeArray
                (pAVar27,pDVar9->indexStorage,local_2b8->m_glesContext);
      attribSpec._0_8_ = pAVar27;
      this_01 = (AttributeArray *)operator_new(0x58);
      anon_unknown_1::AttributeArray::AttributeArray
                (this_01,local_2a8->indexStorage,&local_2b8->m_refContext->super_Context);
      size = local_2e0 + uVar48 * (long)local_2a0;
      random.m_rnd._0_8_ = this_01;
      anon_unknown_1::AttributeArray::data
                (pAVar27,TARGET_ELEMENT_ARRAY,(size_t)size,pcVar60,USAGE_STATIC_DRAW);
      anon_unknown_1::AttributeArray::data
                (this_01,TARGET_ELEMENT_ARRAY,(size_t)size,pcVar60,USAGE_STATIC_DRAW);
      AttributePack::render
                (local_2b8->m_glArrayPack,local_2a8->primitive,local_2a8->drawMethod,0,vertexCount,
                 local_2a8->indexType,pcVar64 + iVar14,local_2a8->indexMin,local_2a8->indexMax,
                 local_2a8->instanceCount,local_2a8->indirectOffset,local_2a8->baseVertex,coordScale
                 ,colorScale,pAVar27);
      AttributePack::render
                (local_2b8->m_rrArrayPack,local_2a8->primitive,local_2a8->drawMethod,0,vertexCount,
                 local_2a8->indexType,pcVar64 + iVar14,local_2a8->indexMin,local_2a8->indexMax,
                 local_2a8->instanceCount,local_2a8->indirectOffset,local_2a8->baseVertex,coordScale
                 ,colorScale,(AttributeArray *)random.m_rnd._0_8_);
      if (pcVar60 != (char *)0x0) {
        operator_delete__(pcVar60);
      }
      de::details::
      UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
      ::~UniqueBase((UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                     *)&random);
      de::details::
      UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
      ::~UniqueBase((UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                     *)&attribSpec);
    }
  }
  else {
    IVar42 = STOP;
    sectionEmitter.m_enabled = false;
    sectionEmitter.m_log = log;
    if (iVar14 != 1) goto LAB_0096b137;
    bVar61 = compare(this,local_2a8->primitive);
    if (!bVar61) {
      CVar15 = DrawTestSpec::isCompatibilityTest(local_2a8);
      piVar1 = &attribSpec.componentCount;
      attribSpec._0_8_ = piVar1;
      if (CVar15 == COMPATIBILITY_UNALIGNED_STRIDE) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&attribSpec,"Failed to draw with unaligned stride.","");
        tcu::ResultCollector::addResult
                  (&local_2b8->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)&attribSpec);
      }
      else if (CVar15 == COMPATIBILITY_UNALIGNED_OFFSET) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&attribSpec,"Failed to draw with unaligned buffers.","");
        tcu::ResultCollector::addResult
                  (&local_2b8->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)&attribSpec);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&attribSpec,"Image comparison failed.","");
        tcu::ResultCollector::addResult
                  (&local_2b8->m_result,QP_TEST_RESULT_FAIL,(string *)&attribSpec);
      }
      if ((int *)attribSpec._0_8_ != piVar1) {
        operator_delete((void *)attribSpec._0_8_,attribSpec._16_8_ + 1);
      }
    }
  }
  pDVar56 = local_2b8;
  tcu::ResultCollector::setTestContextResult
            (&local_2b8->m_result,(local_2b8->super_TestCase).super_TestNode.m_testCtx);
  IVar42 = (IterateResult)((long)iVar2 + 1 != lVar31 * -0x6666666666666666);
  pDVar56->m_iteration = pDVar56->m_iteration + 1;
LAB_0096b137:
  if (sectionEmitter.m_enabled == true) {
    tcu::TestLog::endSection(sectionEmitter.m_log);
  }
  return IVar42;
}

Assistant:

DrawTest::IterateResult DrawTest::iterate (void)
{
	const int					specNdx			= (m_iteration / 2);
	const bool					drawStep		= (m_iteration % 2) == 0;
	const bool					compareStep		= (m_iteration % 2) == 1;
	const IterateResult			iterateResult	= ((size_t)m_iteration + 1 == m_specs.size()*2) ? (STOP) : (CONTINUE);
	const DrawTestSpec&			spec			= m_specs[specNdx];
	const bool					updateProgram	= (m_iteration == 0) || (drawStep && !checkSpecsShaderCompatible(m_specs[specNdx], m_specs[specNdx-1])); // try to use the same shader in all iterations
	IterationLogSectionEmitter	sectionEmitter	(m_testCtx.getLog(), specNdx, m_specs.size(), m_iteration_descriptions[specNdx], drawStep && m_specs.size()!=1);

	if (drawStep)
	{
		const MethodInfo	methodInfo				= getMethodInfo(spec.drawMethod);
		const bool			indexed					= methodInfo.indexed;
		const bool			instanced				= methodInfo.instanced;
		const bool			ranged					= methodInfo.ranged;
		const bool			hasFirst				= methodInfo.first;
		const bool			hasBaseVtx				= methodInfo.baseVertex;

		const size_t		primitiveElementCount	= getElementCount(spec.primitive, spec.primitiveCount);						// !< elements to be drawn
		const int			indexMin				= (ranged) ? (spec.indexMin) : (0);
		const int			firstAddition			= (hasFirst) ? (spec.first) : (0);
		const int			baseVertexAddition		= (hasBaseVtx && spec.baseVertex > 0) ? ( spec.baseVertex) : (0);			// spec.baseVertex > 0 => Create bigger attribute buffer
		const int			indexBase				= (hasBaseVtx && spec.baseVertex < 0) ? (-spec.baseVertex) : (0);			// spec.baseVertex < 0 => Create bigger indices
		const size_t		elementCount			= primitiveElementCount + indexMin + firstAddition + baseVertexAddition;	// !< elements in buffer (buffer should have at least primitiveElementCount ACCESSIBLE (index range, first) elements)
		const int			maxElementIndex			= (int)primitiveElementCount + indexMin + firstAddition - 1;
		const int			indexMax				= de::max(0, (ranged) ? (de::clamp<int>(spec.indexMax, 0, maxElementIndex)) : (maxElementIndex));
		float				coordScale				= getCoordScale(spec);
		float				colorScale				= getColorScale(spec);

		rr::GenericVec4		nullAttribValue;

		// Log info
		m_testCtx.getLog() << TestLog::Message << spec.getMultilineDesc() << TestLog::EndMessage;
		m_testCtx.getLog() << TestLog::Message << TestLog::EndMessage; // extra line for clarity

		// Data

		m_glArrayPack->clearArrays();
		m_rrArrayPack->clearArrays();

		for (int attribNdx = 0; attribNdx < (int)spec.attribs.size(); attribNdx++)
		{
			DrawTestSpec::AttributeSpec attribSpec		= spec.attribs[attribNdx];
			const bool					isPositionAttr	= (attribNdx == 0) || (attribSpec.additionalPositionAttribute);

			if (attribSpec.useDefaultAttribute)
			{
				const int		seed		= 10 * attribSpec.hash() + 100 * spec.hash() + attribNdx;
				rr::GenericVec4 attribValue = RandomArrayGenerator::generateAttributeValue(seed, attribSpec.inputType);

				m_glArrayPack->newArray(DrawTestSpec::STORAGE_USER);
				m_rrArrayPack->newArray(DrawTestSpec::STORAGE_USER);

				m_glArrayPack->getArray(attribNdx)->setupArray(false, 0, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, false, 0, 0, attribValue, isPositionAttr, false);
				m_rrArrayPack->getArray(attribNdx)->setupArray(false, 0, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, false, 0, 0, attribValue, isPositionAttr, false);
			}
			else
			{
				const int					seed					= attribSpec.hash() + 100 * spec.hash() + attribNdx;
				const size_t				elementSize				= attribSpec.componentCount * DrawTestSpec::inputTypeSize(attribSpec.inputType);
				const size_t				stride					= (attribSpec.stride == 0) ? (elementSize) : (attribSpec.stride);
				const size_t				evaluatedElementCount	= (instanced && attribSpec.instanceDivisor > 0) ? (spec.instanceCount / attribSpec.instanceDivisor + 1) : (elementCount);
				const size_t				referencedElementCount	= (ranged) ? (de::max<size_t>(evaluatedElementCount, spec.indexMax + 1)) : (evaluatedElementCount);
				const size_t				bufferSize				= attribSpec.offset + stride * (referencedElementCount - 1) + elementSize;
				const char*					data					= RandomArrayGenerator::generateArray(seed, (int)referencedElementCount, attribSpec.componentCount, attribSpec.offset, (int)stride, attribSpec.inputType);

				try
				{
					m_glArrayPack->newArray(attribSpec.storage);
					m_rrArrayPack->newArray(attribSpec.storage);

					m_glArrayPack->getArray(attribNdx)->data(DrawTestSpec::TARGET_ARRAY, bufferSize, data, attribSpec.usage);
					m_rrArrayPack->getArray(attribNdx)->data(DrawTestSpec::TARGET_ARRAY, bufferSize, data, attribSpec.usage);

					m_glArrayPack->getArray(attribNdx)->setupArray(true, attribSpec.offset, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, attribSpec.normalize, attribSpec.stride, attribSpec.instanceDivisor, nullAttribValue, isPositionAttr, attribSpec.bgraComponentOrder);
					m_rrArrayPack->getArray(attribNdx)->setupArray(true, attribSpec.offset, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, attribSpec.normalize, attribSpec.stride, attribSpec.instanceDivisor, nullAttribValue, isPositionAttr, attribSpec.bgraComponentOrder);

					delete [] data;
					data = NULL;
				}
				catch (...)
				{
					delete [] data;
					throw;
				}
			}
		}

		// Shader program
		if (updateProgram)
		{
			m_glArrayPack->updateProgram();
			m_rrArrayPack->updateProgram();
		}

		// Draw
		try
		{
			// indices
			if (indexed)
			{
				const int		seed				= spec.hash();
				const size_t	indexElementSize	= DrawTestSpec::indexTypeSize(spec.indexType);
				const size_t	indexArraySize		= spec.indexPointerOffset + indexElementSize * elementCount;
				const char*		indexArray			= RandomArrayGenerator::generateIndices(seed, (int)elementCount, spec.indexType, spec.indexPointerOffset, indexMin, indexMax, indexBase);
				const char*		indexPointerBase	= (spec.indexStorage == DrawTestSpec::STORAGE_USER) ? (indexArray) : ((char*)DE_NULL);
				const char*		indexPointer		= indexPointerBase + spec.indexPointerOffset;

				de::UniquePtr<AttributeArray> glArray	(new AttributeArray(spec.indexStorage, *m_glesContext));
				de::UniquePtr<AttributeArray> rrArray	(new AttributeArray(spec.indexStorage, *m_refContext));

				try
				{
					glArray->data(DrawTestSpec::TARGET_ELEMENT_ARRAY, indexArraySize, indexArray, DrawTestSpec::USAGE_STATIC_DRAW);
					rrArray->data(DrawTestSpec::TARGET_ELEMENT_ARRAY, indexArraySize, indexArray, DrawTestSpec::USAGE_STATIC_DRAW);

					m_glArrayPack->render(spec.primitive, spec.drawMethod, 0, (int)primitiveElementCount, spec.indexType, indexPointer, spec.indexMin, spec.indexMax, spec.instanceCount, spec.indirectOffset, spec.baseVertex, coordScale, colorScale, glArray.get());
					m_rrArrayPack->render(spec.primitive, spec.drawMethod, 0, (int)primitiveElementCount, spec.indexType, indexPointer, spec.indexMin, spec.indexMax, spec.instanceCount, spec.indirectOffset, spec.baseVertex, coordScale, colorScale, rrArray.get());

					delete [] indexArray;
					indexArray = NULL;
				}
				catch (...)
				{
					delete [] indexArray;
					throw;
				}
			}
			else
			{
				m_glArrayPack->render(spec.primitive, spec.drawMethod, spec.first, (int)primitiveElementCount, DrawTestSpec::INDEXTYPE_LAST, DE_NULL, 0, 0, spec.instanceCount, spec.indirectOffset, 0, coordScale, colorScale, DE_NULL);
				m_rrArrayPack->render(spec.primitive, spec.drawMethod, spec.first, (int)primitiveElementCount, DrawTestSpec::INDEXTYPE_LAST, DE_NULL, 0, 0, spec.instanceCount, spec.indirectOffset, 0, coordScale, colorScale, DE_NULL);
			}
		}
		catch (glu::Error& err)
		{
			// GL Errors are ok if the mode is not properly aligned

			const DrawTestSpec::CompatibilityTestType ctype = spec.isCompatibilityTest();

			m_testCtx.getLog() << TestLog::Message << "Got error: " << err.what() << TestLog::EndMessage;

			if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				throw;
		}
	}
	else if (compareStep)
	{
		if (!compare(spec.primitive))
		{
			const DrawTestSpec::CompatibilityTestType ctype = spec.isCompatibilityTest();

			if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				m_result.addResult(QP_TEST_RESULT_FAIL, "Image comparison failed.");
		}
	}
	else
	{
		DE_ASSERT(false);
		return STOP;
	}

	m_result.setTestContextResult(m_testCtx);

	m_iteration++;
	return iterateResult;
}